

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__gif_parse_colortable(stbi__context *s,stbi_uc (*pal) [4],int num_entries,int transp)

{
  stbi_uc sVar1;
  int local_24;
  int i;
  int transp_local;
  int num_entries_local;
  stbi_uc (*pal_local) [4];
  stbi__context *s_local;
  
  for (local_24 = 0; local_24 < num_entries; local_24 = local_24 + 1) {
    sVar1 = stbi__get8(s);
    pal[local_24][2] = sVar1;
    sVar1 = stbi__get8(s);
    pal[local_24][1] = sVar1;
    sVar1 = stbi__get8(s);
    pal[local_24][0] = sVar1;
    sVar1 = 0xff;
    if (transp == local_24) {
      sVar1 = '\0';
    }
    pal[local_24][3] = sVar1;
  }
  return;
}

Assistant:

static void stbi__gif_parse_colortable(stbi__context *s, stbi_uc pal[256][4], int num_entries, int transp)
{
   int i;
   for (i=0; i < num_entries; ++i) {
      pal[i][2] = stbi__get8(s);
      pal[i][1] = stbi__get8(s);
      pal[i][0] = stbi__get8(s);
      pal[i][3] = transp == i ? 0 : 255;
   }
}